

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O2

SVInt * __thiscall slang::SVInt::operator+=(SVInt *this,SVInt *rhs)

{
  uint uVar1;
  uint uVar2;
  uint64_t *dst;
  SVInt *pSVar3;
  SVInt SStack_28;
  
  uVar1 = (this->super_SVIntStorage).bitWidth;
  uVar2 = (rhs->super_SVIntStorage).bitWidth;
  if (uVar1 != uVar2) {
    if (uVar2 <= uVar1) {
      extend(&SStack_28,(bitwidth_t)rhs,SUB41(uVar1,0));
      pSVar3 = operator+=(this,&SStack_28);
      ~SVInt(&SStack_28);
      return pSVar3;
    }
    extend(&SStack_28,(bitwidth_t)this,SUB41(uVar2,0));
    operator=(this,&SStack_28);
    ~SVInt(&SStack_28);
  }
  if (((this->super_SVIntStorage).unknownFlag == false) &&
     ((rhs->super_SVIntStorage).unknownFlag != true)) {
    uVar1 = (this->super_SVIntStorage).bitWidth;
    if (uVar1 < 0x41) {
      (this->super_SVIntStorage).field_0.pVal =
           (uint64_t *)
           ((long)(this->super_SVIntStorage).field_0.pVal +
           (long)(rhs->super_SVIntStorage).field_0.pVal);
    }
    else {
      dst = (this->super_SVIntStorage).field_0.pVal;
      addGeneral(dst,dst,(rhs->super_SVIntStorage).field_0.pVal,uVar1 + 0x3f >> 6);
    }
    clearUnusedBits(this);
  }
  else {
    setAllX(this);
  }
  return this;
}

Assistant:

SVInt& SVInt::operator+=(const SVInt& rhs) {
    if (bitWidth != rhs.bitWidth) {
        if (bitWidth < rhs.bitWidth)
            *this = extend(rhs.bitWidth, signFlag && rhs.signFlag);
        else
            return *this += rhs.extend(bitWidth, signFlag && rhs.signFlag);
    }

    if (unknownFlag || rhs.unknownFlag)
        setAllX();
    else {
        if (isSingleWord())
            val += rhs.val;
        else
            addGeneral(pVal, pVal, rhs.pVal, getNumWords());
        clearUnusedBits();
    }
    return *this;
}